

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* bech32::LocateErrors(string *str,CharLimit limit)

{
  value_type vVar1;
  short sVar2;
  uint uVar3;
  bool bVar4;
  __optional_eq_t<bech32::Encoding,_bech32::Encoding> _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  size_type sVar11;
  ulong uVar12;
  byte *pbVar13;
  reference pvVar14;
  const_iterator pEVar15;
  const_reference pvVar16;
  ulong uVar17;
  const_reference pvVar18;
  string *psVar19;
  char *__x;
  uint uVar20;
  ulong in_RDX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  int l_e1_1;
  int l_e2;
  int inv_p1_p2;
  int l_s1_s0p2;
  int s1_s0p2;
  size_t p2;
  int l_s1_s0p1;
  int s1_s0p1;
  int l_s2_s1p1;
  int s2_s1p1;
  size_t p1_1;
  int l_e1;
  size_t p1;
  int l_s2;
  int l_s1;
  int l_s0;
  int s2;
  int s1;
  int s0;
  uint32_t syn;
  uint32_t residue;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bech32::Encoding> *__range1;
  int8_t rev;
  uchar c;
  size_t i_1;
  size_t length;
  size_t i;
  size_t pos;
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  vector<int,_std::allocator<int>_> possible_errors;
  Encoding encoding;
  data values;
  vector<int,_std::allocator<int>_> error_locations;
  optional<bech32::Encoding> error_encoding;
  string error_message;
  string hrp;
  undefined4 in_stack_fffffffffffffbe8;
  Encoding in_stack_fffffffffffffbec;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffbf0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  string *in_stack_fffffffffffffc18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_fffffffffffffc20;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  *this;
  allocator<char> *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  uint local_3a8;
  data *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  uint local_390;
  uint local_378;
  ulong local_2c0;
  const_iterator local_280;
  ulong local_268;
  ulong local_258;
  undefined4 local_250;
  undefined1 local_201 [25];
  undefined8 local_1e8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  Encoding local_174;
  undefined4 *local_170;
  undefined8 local_168;
  undefined4 local_140;
  undefined4 local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_30;
  undefined4 local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_78,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  if (in_RDX < sVar11) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc08,
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
    std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
    std::make_pair<char_const(&)[23],std::vector<int,std::allocator<int>>>
              ((char (*) [23])in_stack_fffffffffffffbf8._M_current,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
              (in_stack_fffffffffffffc20,
               (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffc18);
    std::pair<const_char_*,_std::vector<int,_std::allocator<int>_>_>::~pair
              ((pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  }
  else {
    bVar4 = anon_unknown_0::CheckCharacters
                      (in_stack_fffffffffffffc18,
                       (vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    if (bVar4) {
      local_268 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind(in_stack_fffffffffffffc08,(char)((ulong)in_stack_fffffffffffffc18 >> 0x38),
                        CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
      if (local_268 == 0xffffffffffffffff) {
        local_f8 = 0;
        uStack_f0 = 0;
        local_e8 = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::make_pair<char_const(&)[18],std::vector<int,std::allocator<int>>>
                  ((char (*) [18])in_stack_fffffffffffffbf8._M_current,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                  (in_stack_fffffffffffffc20,
                   (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_fffffffffffffc18);
        std::pair<const_char_*,_std::vector<int,_std::allocator<int>_>_>::~pair
                  ((pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf8._M_current);
      }
      else if ((local_268 == 0) ||
              (sVar11 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
              , sVar11 <= local_268 + 6)) {
        local_250 = (undefined4)local_268;
        local_fc = local_250;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (value_type_conflict2 *)0x18e9e3c);
        std::make_pair<char_const(&)[27],std::vector<int,std::allocator<int>>>
                  ((char (*) [27])in_stack_fffffffffffffbf8._M_current,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                  (in_stack_fffffffffffffc20,
                   (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_fffffffffffffc18);
        std::pair<const_char_*,_std::vector<int,_std::allocator<int>_>_>::~pair
                  ((pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                   (size_type)in_stack_fffffffffffffc18);
        for (local_258 = 0; local_258 < local_268; local_258 = local_258 + 1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbf8._M_current,
                     (size_type)in_stack_fffffffffffffbf0._M_current);
          anon_unknown_0::LowerCase((uchar)(in_stack_fffffffffffffbec >> 0x18));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbf8._M_current,
                     (char)((ulong)in_stack_fffffffffffffbf0._M_current >> 0x38));
        }
        sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        uVar12 = ~local_268 + sVar11;
        std::allocator<unsigned_char>::allocator
                  ((allocator<unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffc18,
                   CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                   (allocator_type *)in_stack_fffffffffffffc08);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        while( true ) {
          local_268 = local_268 + 1;
          sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          if (sVar11 <= local_268) break;
          pbVar13 = (byte *)std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffffbf8._M_current,
                                       (size_type)in_stack_fffffffffffffbf0._M_current);
          vVar1 = (anonymous_namespace)::CHARSET_REV[*pbVar13];
          if (vVar1 == 0xff) {
            local_140 = (undefined4)local_268;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                       (value_type_conflict2 *)0x18ea0a1);
            std::make_pair<char_const(&)[26],std::vector<int,std::allocator<int>>>
                      ((char (*) [26])in_stack_fffffffffffffbf8._M_current,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                      (in_stack_fffffffffffffc20,
                       (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffc18);
            std::pair<const_char_*,_std::vector<int,_std::allocator<int>_>_>::~pair
                      ((pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            goto LAB_018ead2b;
          }
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffbf8._M_current,
                               (size_type)in_stack_fffffffffffffbf0._M_current);
          *pvVar14 = vVar1;
        }
        std::optional<bech32::Encoding>::optional
                  ((optional<bech32::Encoding> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        local_30 = 1;
        local_2c = 2;
        local_170 = &local_30;
        local_168 = 2;
        local_280 = std::initializer_list<bech32::Encoding>::begin
                              ((initializer_list<bech32::Encoding> *)
                               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        pEVar15 = std::initializer_list<bech32::Encoding>::end
                            ((initializer_list<bech32::Encoding> *)
                             in_stack_fffffffffffffbf8._M_current);
        for (; local_280 != pEVar15; local_280 = local_280 + 1) {
          local_174 = *local_280;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
          anon_unknown_0::PreparePolynomialCoefficients
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
          uVar6 = anon_unknown_0::PolyMod((data *)in_stack_fffffffffffffbf8._M_current);
          uVar7 = anon_unknown_0::EncodingConstant(in_stack_fffffffffffffbec);
          if (uVar6 == uVar7) {
            local_201._9_8_ = 0;
            local_201._17_8_ = 0;
            local_1e8 = 0;
            this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)(local_201 + 9);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            std::make_pair<char_const(&)[1],std::vector<int,std::allocator<int>>>
                      ((char (*) [1])in_stack_fffffffffffffbf8._M_current,
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                      (this,(pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_fffffffffffffc18);
            std::pair<const_char_*,_std::vector<int,_std::allocator<int>_>_>::~pair
                      ((pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf8._M_current);
            bVar4 = true;
          }
          else {
            uVar6 = anon_unknown_0::Syndrome
                              ((uint32_t)((ulong)in_stack_fffffffffffffbf8._M_current >> 0x20));
            uVar8 = uVar6 >> 10 & 0x3ff;
            pvVar16 = std::array<short,_1024UL>::at
                                ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                 CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            iVar9 = (int)*pvVar16;
            pvVar16 = std::array<short,_1024UL>::at
                                ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                 CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            iVar10 = (int)*pvVar16;
            pvVar16 = std::array<short,_1024UL>::at
                                ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                 CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            if ((((iVar9 == -1) || (iVar10 == -1)) || (*pvVar16 == -1)) ||
               ((((iVar10 * 2 - (int)*pvVar16) - iVar9) + 0x7fe) % 0x3ff != 0)) {
              for (local_2c0 = 0; local_2c0 < uVar12; local_2c0 = local_2c0 + 1) {
                if (uVar8 == 0) {
                  local_378 = 0;
                }
                else {
                  pvVar18 = std::array<short,_1023UL>::at
                                      ((array<short,_1023UL> *)in_stack_fffffffffffffc08,
                                       CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)
                                      );
                  local_378 = (uint)*pvVar18;
                }
                if (uVar6 >> 0x14 != local_378) {
                  pvVar16 = std::array<short,_1024UL>::at
                                      ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                       CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)
                                      );
                  sVar2 = *pvVar16;
                  if ((uVar6 & 0x3ff) == 0) {
                    local_390 = 0;
                  }
                  else {
                    in_stack_fffffffffffffc68 =
                         (string *)
                         std::array<short,_1023UL>::at
                                   ((array<short,_1023UL> *)in_stack_fffffffffffffc08,
                                    CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
                    local_390 = (uint)*(short *)&(in_stack_fffffffffffffc68->_M_dataplus)._M_p;
                  }
                  if (uVar8 != local_390) {
                    in_stack_fffffffffffffc60 =
                         (data *)std::array<short,_1024UL>::at
                                           ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                            CONCAT17(in_stack_fffffffffffffc07,
                                                     in_stack_fffffffffffffc00));
                    iVar9 = (int)*(short *)&(in_stack_fffffffffffffc60->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl.super__Vector_impl_data._M_start;
                    uVar20 = ((sVar2 - iVar9) + 0x3ff) % 0x3ff;
                    uVar17 = (ulong)(int)uVar20;
                    if ((uVar17 < uVar12) && (local_2c0 != uVar17)) {
                      if ((uVar6 & 0x3ff) == 0) {
                        local_3a8 = 0;
                      }
                      else {
                        pvVar18 = std::array<short,_1023UL>::at
                                            ((array<short,_1023UL> *)in_stack_fffffffffffffc08,
                                             CONCAT17(in_stack_fffffffffffffc07,
                                                      in_stack_fffffffffffffc00));
                        local_3a8 = (uint)*pvVar18;
                      }
                      if (uVar8 != local_3a8) {
                        pvVar16 = std::array<short,_1024UL>::at
                                            ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                             CONCAT17(in_stack_fffffffffffffc07,
                                                      in_stack_fffffffffffffc00));
                        sVar2 = *pvVar16;
                        pvVar18 = std::array<short,_1023UL>::at
                                            ((array<short,_1023UL> *)in_stack_fffffffffffffc08,
                                             CONCAT17(in_stack_fffffffffffffc07,
                                                      in_stack_fffffffffffffc00));
                        in_stack_fffffffffffffc34 = (int)*pvVar18;
                        in_stack_fffffffffffffc38 =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::array<short,_1023UL>::at
                                       ((array<short,_1023UL> *)in_stack_fffffffffffffc08,
                                        CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00
                                                ));
                        in_stack_fffffffffffffc28 =
                             (allocator<char> *)
                             std::array<short,_1024UL>::at
                                       ((array<short,_1024UL> *)in_stack_fffffffffffffc08,
                                        CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00
                                                ));
                        if (((int)(iVar9 + (0x3ff - *(short *)in_stack_fffffffffffffc28) +
                                  uVar20 * 0x1a) % 0x21 == 0) &&
                           (uVar3 = (uint)local_2c0,
                           (int)((int)sVar2 + (0x3ff - *(short *)in_stack_fffffffffffffc28) +
                                uVar3 * 0x1a) % 0x21 == 0)) {
                          if (uVar17 < local_2c0) {
                            sVar11 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffbec,
                                                        in_stack_fffffffffffffbe8));
                            local_1b0 = ~uVar3 + (int)sVar11;
                            std::vector<int,_std::allocator<int>_>::push_back
                                      ((vector<int,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                       ,(value_type_conflict2 *)0x18ea92c);
                            sVar11 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffbec,
                                                        in_stack_fffffffffffffbe8));
                            local_1b4 = ~uVar20 + (int)sVar11;
                            std::vector<int,_std::allocator<int>_>::push_back
                                      ((vector<int,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                       ,(value_type_conflict2 *)0x18ea965);
                          }
                          else {
                            sVar11 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffbec,
                                                        in_stack_fffffffffffffbe8));
                            local_1b8 = ~uVar20 + (int)sVar11;
                            std::vector<int,_std::allocator<int>_>::push_back
                                      ((vector<int,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                       ,(value_type_conflict2 *)0x18ea9a0);
                            sVar11 = std::__cxx11::
                                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffffbec,
                                                        in_stack_fffffffffffffbe8));
                            local_1bc = ~uVar3 + (int)sVar11;
                            std::vector<int,_std::allocator<int>_>::push_back
                                      ((vector<int,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                       ,(value_type_conflict2 *)0x18ea9d9);
                          }
                          break;
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              uVar8 = ((iVar10 - iVar9) + 0x3ff) % 0x3ff;
              if (((ulong)(long)(int)uVar8 < uVar12) && ((int)(iVar9 + uVar8 * 0x1a) % 0x21 == 0)) {
                sVar11 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                                   );
                local_1ac = ~uVar8 + (int)sVar11;
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           (value_type_conflict2 *)0x18ea4b9);
              }
            }
            bVar4 = std::vector<int,_std::allocator<int>_>::empty
                              ((vector<int,_std::allocator<int>_> *)
                               in_stack_fffffffffffffbf8._M_current);
            if (bVar4) {
LAB_018eab23:
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf8._M_current,
                         (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
              bVar4 = std::vector<int,_std::allocator<int>_>::empty
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffbf8._M_current);
              if (!bVar4) {
                std::optional<bech32::Encoding>::optional<bech32::Encoding_&,_true>
                          ((optional<bech32::Encoding> *)in_stack_fffffffffffffbf8._M_current,
                           (Encoding *)in_stack_fffffffffffffbf0._M_current);
                local_58 = local_60;
              }
            }
            else {
              bVar4 = std::vector<int,_std::allocator<int>_>::empty
                                ((vector<int,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffbf8._M_current);
              if (!bVar4) {
                in_stack_fffffffffffffc18 =
                     (string *)
                     std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                psVar19 = (string *)
                          std::vector<int,_std::allocator<int>_>::size
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
                if (in_stack_fffffffffffffc18 < psVar19) goto LAB_018eab23;
              }
            }
            bVar4 = false;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffbf8._M_current);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf8._M_current);
          if (bVar4) goto LAB_018ead2b;
        }
        local_201._5_4_ = 2;
        _Var5 = std::operator==((optional<bech32::Encoding> *)in_stack_fffffffffffffbf8._M_current,
                                (Encoding *)in_stack_fffffffffffffbf0._M_current);
        if (_Var5) {
          __x = "Invalid Bech32m checksum";
        }
        else {
          local_201._1_4_ = 1;
          _Var5 = std::operator==((optional<bech32::Encoding> *)in_stack_fffffffffffffbf8._M_current
                                  ,(Encoding *)in_stack_fffffffffffffbf0._M_current);
          __x = "Invalid checksum";
          if (_Var5) {
            __x = "Invalid Bech32 checksum";
          }
        }
        in_stack_fffffffffffffbf8._M_current = (int *)local_201;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc38,
                   (char *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   in_stack_fffffffffffffc28);
        std::allocator<char>::~allocator((allocator<char> *)local_201);
        std::make_pair<std::__cxx11::string&,std::vector<int,std::allocator<int>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
LAB_018ead2b:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffbf8._M_current);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      }
    }
    else {
      std::make_pair<char_const(&)[32],std::vector<int,std::allocator<int>>>
                ((char (*) [32])in_stack_fffffffffffffbf8._M_current,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::pair<const_char_*,_std::vector<int,_std::allocator<int>_>,_true>
                (in_stack_fffffffffffffc20,
                 (pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffc18);
      std::pair<const_char_*,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<const_char_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf8._M_current);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::pair<std::string, std::vector<int>> LocateErrors(const std::string& str, CharLimit limit) {
    std::vector<int> error_locations{};

    if (str.size() > limit) {
        error_locations.resize(str.size() - limit);
        std::iota(error_locations.begin(), error_locations.end(), static_cast<int>(limit));
        return std::make_pair("Bech32 string too long", std::move(error_locations));
    }

    if (!CheckCharacters(str, error_locations)){
        return std::make_pair("Invalid character or mixed case", std::move(error_locations));
    }

    size_t pos = str.rfind('1');
    if (pos == str.npos) {
        return std::make_pair("Missing separator", std::vector<int>{});
    }
    if (pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        error_locations.push_back(pos);
        return std::make_pair("Invalid separator position", std::move(error_locations));
    }

    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }

    size_t length = str.size() - 1 - pos; // length of data part
    data values(length);
    for (size_t i = pos + 1; i < str.size(); ++i) {
        unsigned char c = str[i];
        int8_t rev = CHARSET_REV[c];
        if (rev == -1) {
            error_locations.push_back(i);
            return std::make_pair("Invalid Base 32 character", std::move(error_locations));
        }
        values[i - pos - 1] = rev;
    }

    // We attempt error detection with both bech32 and bech32m, and choose the one with the fewest errors
    // We can't simply use the segwit version, because that may be one of the errors
    std::optional<Encoding> error_encoding;
    for (Encoding encoding : {Encoding::BECH32, Encoding::BECH32M}) {
        std::vector<int> possible_errors;
        // Recall that (expanded hrp + values) is interpreted as a list of coefficients of a polynomial
        // over GF(32). PolyMod computes the "remainder" of this polynomial modulo the generator G(x).
        auto enc = PreparePolynomialCoefficients(hrp, values);
        uint32_t residue = PolyMod(enc) ^ EncodingConstant(encoding);

        // All valid codewords should be multiples of G(x), so this remainder (after XORing with the encoding
        // constant) should be 0 - hence 0 indicates there are no errors present.
        if (residue != 0) {
            // If errors are present, our polynomial must be of the form C(x) + E(x) where C is the valid
            // codeword (a multiple of G(x)), and E encodes the errors.
            uint32_t syn = Syndrome(residue);

            // Unpack the three 10-bit syndrome values
            int s0 = syn & 0x3FF;
            int s1 = (syn >> 10) & 0x3FF;
            int s2 = syn >> 20;

            // Get the discrete logs of these values in GF1024 for more efficient computation
            int l_s0 = GF1024_LOG.at(s0);
            int l_s1 = GF1024_LOG.at(s1);
            int l_s2 = GF1024_LOG.at(s2);

            // First, suppose there is only a single error. Then E(x) = e1*x^p1 for some position p1
            // Then s0 = E((e)^997) = e1*(e)^(997*p1) and s1 = E((e)^998) = e1*(e)^(998*p1)
            // Therefore s1/s0 = (e)^p1, and by the same logic, s2/s1 = (e)^p1 too.
            // Hence, s1^2 == s0*s2, which is exactly the condition we check first:
            if (l_s0 != -1 && l_s1 != -1 && l_s2 != -1 && (2 * l_s1 - l_s2 - l_s0 + 2046) % 1023 == 0) {
                // Compute the error position p1 as l_s1 - l_s0 = p1 (mod 1023)
                size_t p1 = (l_s1 - l_s0 + 1023) % 1023; // the +1023 ensures it is positive
                // Now because s0 = e1*(e)^(997*p1), we get e1 = s0/((e)^(997*p1)). Remember that (e)^1023 = 1,
                // so 1/((e)^997) = (e)^(1023-997).
                int l_e1 = l_s0 + (1023 - 997) * p1;
                // Finally, some sanity checks on the result:
                // - The error position should be within the length of the data
                // - e1 should be in GF(32), which implies that e1 = (e)^(33k) for some k (the 31 non-zero elements
                // of GF(32) form an index 33 subgroup of the 1023 non-zero elements of GF(1024)).
                if (p1 < length && !(l_e1 % 33)) {
                    // Polynomials run from highest power to lowest, so the index p1 is from the right.
                    // We don't return e1 because it is dangerous to suggest corrections to the user,
                    // the user should check the address themselves.
                    possible_errors.push_back(str.size() - p1 - 1);
                }
            // Otherwise, suppose there are two errors. Then E(x) = e1*x^p1 + e2*x^p2.
            } else {
                // For all possible first error positions p1
                for (size_t p1 = 0; p1 < length; ++p1) {
                    // We have guessed p1, and want to solve for p2. Recall that E(x) = e1*x^p1 + e2*x^p2, so
                    // s0 = E((e)^997) = e1*(e)^(997^p1) + e2*(e)^(997*p2), and similar for s1 and s2.
                    //
                    // Consider s2 + s1*(e)^p1
                    //          = 2e1*(e)^(999^p1) + e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //          = e2*(e)^(999*p2) + e2*(e)^(998*p2)*(e)^p1
                    //    (Because we are working in characteristic 2.)
                    //          = e2*(e)^(998*p2) ((e)^p2 + (e)^p1)
                    //
                    int s2_s1p1 = s2 ^ (s1 == 0 ? 0 : GF1024_EXP.at((l_s1 + p1) % 1023));
                    if (s2_s1p1 == 0) continue;
                    int l_s2_s1p1 = GF1024_LOG.at(s2_s1p1);

                    // Similarly, s1 + s0*(e)^p1
                    //          = e2*(e)^(997*p2) ((e)^p2 + (e)^p1)
                    int s1_s0p1 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p1) % 1023));
                    if (s1_s0p1 == 0) continue;
                    int l_s1_s0p1 = GF1024_LOG.at(s1_s0p1);

                    // So, putting these together, we can compute the second error position as
                    // (e)^p2 = (s2 + s1^p1)/(s1 + s0^p1)
                    // p2 = log((e)^p2)
                    size_t p2 = (l_s2_s1p1 - l_s1_s0p1 + 1023) % 1023;

                    // Sanity checks that p2 is a valid position and not the same as p1
                    if (p2 >= length || p1 == p2) continue;

                    // Now we want to compute the error values e1 and e2.
                    // Similar to above, we compute s1 + s0*(e)^p2
                    //          = e1*(e)^(997*p1) ((e)^p1 + (e)^p2)
                    int s1_s0p2 = s1 ^ (s0 == 0 ? 0 : GF1024_EXP.at((l_s0 + p2) % 1023));
                    if (s1_s0p2 == 0) continue;
                    int l_s1_s0p2 = GF1024_LOG.at(s1_s0p2);

                    // And compute (the log of) 1/((e)^p1 + (e)^p2))
                    int inv_p1_p2 = 1023 - GF1024_LOG.at(GF1024_EXP.at(p1) ^ GF1024_EXP.at(p2));

                    // Then (s1 + s0*(e)^p1) * (1/((e)^p1 + (e)^p2)))
                    //         = e2*(e)^(997*p2)
                    // Then recover e2 by dividing by (e)^(997*p2)
                    int l_e2 = l_s1_s0p1 + inv_p1_p2 + (1023 - 997) * p2;
                    // Check that e2 is in GF(32)
                    if (l_e2 % 33) continue;

                    // In the same way, (s1 + s0*(e)^p2) * (1/((e)^p1 + (e)^p2)))
                    //         = e1*(e)^(997*p1)
                    // So recover e1 by dividing by (e)^(997*p1)
                    int l_e1 = l_s1_s0p2 + inv_p1_p2 + (1023 - 997) * p1;
                    // Check that e1 is in GF(32)
                    if (l_e1 % 33) continue;

                    // Again, we do not return e1 or e2 for safety.
                    // Order the error positions from the left of the string and return them
                    if (p1 > p2) {
                        possible_errors.push_back(str.size() - p1 - 1);
                        possible_errors.push_back(str.size() - p2 - 1);
                    } else {
                        possible_errors.push_back(str.size() - p2 - 1);
                        possible_errors.push_back(str.size() - p1 - 1);
                    }
                    break;
                }
            }
        } else {
            // No errors
            return std::make_pair("", std::vector<int>{});
        }

        if (error_locations.empty() || (!possible_errors.empty() && possible_errors.size() < error_locations.size())) {
            error_locations = std::move(possible_errors);
            if (!error_locations.empty()) error_encoding = encoding;
        }
    }
    std::string error_message = error_encoding == Encoding::BECH32M ? "Invalid Bech32m checksum"
                              : error_encoding == Encoding::BECH32 ? "Invalid Bech32 checksum"
                              : "Invalid checksum";

    return std::make_pair(error_message, std::move(error_locations));
}